

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath.cpp
# Opt level: O2

string * directoryOf(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  
  while (((filename->_M_string_length != 0 &&
          (cVar1 = (filename->_M_dataplus)._M_p[filename->_M_string_length - 1], cVar1 != '/')) &&
         (cVar1 != '\\'))) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  return __return_storage_ptr__;
}

Assistant:

std::string directoryOf(std::string filename) {
	while (!filename.empty() && filename.back()!='\\' && filename.back()!='/')
		filename.pop_back();
	return filename;
}